

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

int32 it_sigrenderer_get_samples
                (sigrenderer_t *vsigrenderer,double volume,double delta,int32 size,
                sample_t_conflict **samples)

{
  int iVar1;
  int iVar2;
  double halflife;
  long in_RDX;
  int in_ESI;
  DUMB_CLICK_REMOVER **in_RDI;
  double in_XMM1_Qa;
  longlong t;
  int32 todo;
  int dt;
  int32 pos;
  DUMB_IT_SIGRENDERER *sigrenderer;
  int32 in_stack_ffffffffffffffa8;
  int32 in_stack_ffffffffffffffac;
  double in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int local_24;
  int local_4;
  
  if (*(int *)((long)in_RDI + 0x2e2c) < 0) {
    local_4 = 0;
  }
  else {
    local_4 = 0;
    iVar1 = (int)(in_XMM1_Qa * 65536.0 + 0.5);
    local_24 = in_ESI;
    do {
      iVar2 = (int)(((long)*(int *)(in_RDI + 0x5cc) << 0x10 | (long)*(int *)((long)in_RDI + 0x2e64))
                   / (long)iVar1);
      if (local_24 <= iVar2) {
        render((DUMB_IT_SIGRENDERER *)CONCAT44(local_4,iVar1),
               (double)CONCAT44(iVar2,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,(sample_t_conflict **)0x9aeb61);
        local_4 = local_24 + local_4;
        halflife = (double)((long)*(int *)((long)in_RDI + 0x2e64) - (long)local_24 * (long)iVar1);
        *(uint *)((long)in_RDI + 0x2e64) = SUB84(halflife,0) & 0xffff;
        *(int *)(in_RDI + 0x5cc) = (int)((ulong)halflife >> 0x10) + *(int *)(in_RDI + 0x5cc);
        if (in_RDX == 0) {
          return local_4;
        }
        dumb_remove_clicks_array
                  ((int)((ulong)in_RDX >> 0x20),in_RDI,(sample_t_conflict **)CONCAT44(local_4,iVar1)
                   ,iVar2,halflife);
        return local_4;
      }
      render((DUMB_IT_SIGRENDERER *)CONCAT44(local_4,iVar1),
             (double)CONCAT44(iVar2,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,(sample_t_conflict **)0x9aea8f);
      local_4 = iVar2 + local_4;
      local_24 = local_24 - iVar2;
      in_stack_ffffffffffffffb0 =
           (double)((long)*(int *)((long)in_RDI + 0x2e64) - (long)iVar2 * (long)iVar1);
      *(uint *)((long)in_RDI + 0x2e64) = SUB84(in_stack_ffffffffffffffb0,0) & 0xffff;
      *(int *)(in_RDI + 0x5cc) =
           (int)((ulong)in_stack_ffffffffffffffb0 >> 0x10) + *(int *)(in_RDI + 0x5cc);
      iVar2 = process_tick(_dt);
    } while (iVar2 == 0);
    *(undefined4 *)((long)in_RDI + 0x2e2c) = 0xffffffff;
    *(undefined4 *)(in_RDI + 0x5c6) = 0xffffffff;
  }
  return local_4;
}

Assistant:

static int32 it_sigrenderer_get_samples(
	sigrenderer_t *vsigrenderer,
	double volume, double delta,
	int32 size, sample_t **samples
)
{
	DUMB_IT_SIGRENDERER *sigrenderer = vsigrenderer;
	int32 pos;
	int dt;
	int32 todo;
	LONG_LONG t;

	if (sigrenderer->order < 0) return 0; // problematic

	pos = 0;
	dt = (int)(delta * 65536.0f + 0.5f);

	/* When samples is finally used in render_playing(), it won't be used if
	 * volume is 0.
	 */
	if (!samples) volume = 0;

	for (;;) {
		todo = (long)((((LONG_LONG)sigrenderer->time_left << 16) | sigrenderer->sub_time_left) / dt);

		if (todo >= size)
			break;

		render(sigrenderer, volume, delta, pos, todo, samples);

		pos += todo;
		size -= todo;

		t = sigrenderer->sub_time_left - (LONG_LONG)todo * dt;
		sigrenderer->sub_time_left = (int32)t & 65535;
		sigrenderer->time_left += (int32)(t >> 16);

		if (process_tick(sigrenderer)) {
			sigrenderer->order = -1;
			sigrenderer->row = -1;
			return pos;
		}
	}

	render(sigrenderer, volume, delta, pos, size, samples);

	pos += size;

	t = sigrenderer->sub_time_left - (LONG_LONG)size * dt;
	sigrenderer->sub_time_left = (int32)t & 65535;
	sigrenderer->time_left += (int32)(t >> 16);

	if (samples)
		dumb_remove_clicks_array(sigrenderer->n_channels, sigrenderer->click_remover, samples, pos, 512.0f / delta);

	return pos;
}